

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::BatchnormLayerParams::MergePartialFromCodedStream
          (BatchnormLayerParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  float *pfVar5;
  bool bVar6;
  short extraout_AX;
  short extraout_AX_00;
  short sVar7;
  float fVar8;
  uint32 uVar9;
  ulong extraout_RAX;
  WeightParams *pWVar10;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  pair<unsigned_long,_bool> pVar14;
  float local_64;
  WeightParams **local_60;
  WeightParams **local_58;
  WeightParams **local_50;
  WeightParams **local_48;
  bool *local_40;
  bool *local_38;
  
  local_48 = &this->variance_;
  local_50 = &this->mean_;
  local_58 = &this->beta_;
  local_60 = &this->gamma_;
  local_38 = &this->instancenormalization_;
  local_40 = &this->computemeanvar_;
  do {
    pbVar3 = input->buffer_;
    uVar9 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      pbVar1 = pbVar3 + 1;
      uVar12 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar9 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) ||
           (uVar9 = (uint)bVar2, (~(uint)*pbVar1 & uVar12) < 0x80)) goto LAB_00232fde;
        uVar12 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar13 = (ulong)uVar12 | 0x100000000;
    }
    else {
LAB_00232fde:
      uVar9 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar9);
      uVar13 = 0;
      if (uVar9 - 1 < 0x3fff) {
        uVar13 = 0x100000000;
      }
      uVar13 = uVar9 | uVar13;
    }
    uVar12 = (uint)uVar13;
    if ((uVar13 & 0x100000000) == 0) goto switchD_00232df1_caseD_2;
    cVar11 = (char)uVar13;
    switch((uint)(uVar13 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar11 != '\b') break;
      puVar4 = input->buffer_;
      if ((input->buffer_end_ <= puVar4) || ((long)(char)*puVar4 < 0)) {
        pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->channels_ = pVar14.first;
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
        goto LAB_00232dce;
        goto LAB_00233018;
      }
      this->channels_ = (long)(char)*puVar4;
      input->buffer_ = puVar4 + 1;
      goto LAB_00232dce;
    case 5:
      MergePartialFromCodedStream();
      sVar7 = extraout_AX;
      goto LAB_00232fbf;
    case 6:
      MergePartialFromCodedStream();
      sVar7 = extraout_AX_00;
LAB_00232fbf:
      if (sVar7 == 0) break;
      fVar8 = 8.40779e-45;
      if (sVar7 != 1) goto LAB_00232dce;
      goto LAB_00232dd0;
    case 10:
      if (cVar11 == 'U') {
        pfVar5 = (float *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pfVar5 < 4) {
          bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)&local_64);
          if (!bVar6) goto LAB_00233018;
        }
        else {
          local_64 = *pfVar5;
          input->buffer_ = (uint8 *)(pfVar5 + 1);
        }
        this->epsilon_ = local_64;
        goto LAB_00232dce;
      }
      break;
    case 0xf:
      if (cVar11 != 'z') break;
      if (*local_60 == (WeightParams *)0x0) {
        pWVar10 = (WeightParams *)operator_new(0x50);
        WeightParams::WeightParams(pWVar10);
        *local_60 = pWVar10;
      }
      MergePartialFromCodedStream();
      uVar13 = extraout_RAX_01;
LAB_00232f6c:
      fVar8 = local_64;
      if ((uVar13 & 1) == 0) goto LAB_00232dce;
      goto LAB_00232dd0;
    case 0x10:
      if (cVar11 == -0x7e) {
        if (*local_58 == (WeightParams *)0x0) {
          pWVar10 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(pWVar10);
          *local_58 = pWVar10;
        }
        MergePartialFromCodedStream();
        uVar13 = extraout_RAX;
        goto LAB_00232f6c;
      }
      break;
    case 0x11:
      if (cVar11 == -0x76) {
        if (*local_50 == (WeightParams *)0x0) {
          pWVar10 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(pWVar10);
          *local_50 = pWVar10;
        }
        MergePartialFromCodedStream();
        uVar13 = extraout_RAX_02;
        goto LAB_00232f6c;
      }
      break;
    case 0x12:
      if (cVar11 == -0x6e) {
        if (*local_48 == (WeightParams *)0x0) {
          pWVar10 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(pWVar10);
          *local_48 = pWVar10;
        }
        MergePartialFromCodedStream();
        uVar13 = extraout_RAX_00;
        goto LAB_00232f6c;
      }
    }
switchD_00232df1_caseD_2:
    fVar8 = 9.80909e-45;
    if ((uVar12 & 7) != 4 && uVar12 != 0) {
      bVar6 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar12);
      if (bVar6) {
LAB_00232dce:
        fVar8 = 0.0;
      }
      else {
LAB_00233018:
        fVar8 = 8.40779e-45;
      }
    }
LAB_00232dd0:
    if (fVar8 != 0.0) {
      return fVar8 != 8.40779e-45;
    }
  } while( true );
}

Assistant:

bool BatchnormLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.BatchnormLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 channels = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &channels_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool computeMeanVar = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &computemeanvar_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool instanceNormalization = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &instancenormalization_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float epsilon = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(85u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &epsilon_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams gamma = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_gamma()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams beta = 16;
      case 16: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(130u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_beta()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams mean = 17;
      case 17: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(138u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_mean()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams variance = 18;
      case 18: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(146u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_variance()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.BatchnormLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.BatchnormLayerParams)
  return false;
#undef DO_
}